

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::Attribute_Access<int,_MyException>::do_call
          (Attribute_Access<int,_MyException> *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Boxed_Value *this_00;
  Type_Conversions_State *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Boxed_Value BVar3;
  MyException *o_1;
  MyException *o;
  Boxed_Value *bv;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  Attribute_Access<int,_MyException> *this_local;
  
  this_00 = Function_Params::operator[]((Function_Params *)t_conversions,0);
  bVar1 = Boxed_Value::is_const(this_00);
  if (bVar1) {
    boxed_cast<MyException_const*>(this_00,in_RCX);
    BVar3 = do_call_impl<int>(this,(MyException *)params);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    boxed_cast<MyException*>(this_00,in_RCX);
    BVar3 = do_call_impl<int>(this,(MyException *)params);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const Boxed_Value &bv = params[0];
        if (bv.is_const()) {
          const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        } else {
          Class *o = boxed_cast<Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        }
      }